

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

cio_error write_some_all(cio_io_stream *io_stream,cio_write_buffer *buf,
                        cio_io_stream_write_handler_t handler,void *handler_context)

{
  size_t __n;
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  cio_write_buffer *pcVar6;
  
  uVar1 = (buf->data).head.q_len;
  sVar4 = write_check_buffer_pos;
  if (uVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar3 = 0;
    sVar5 = 0;
    pcVar6 = buf;
    do {
      pcVar6 = pcVar6->next;
      __n = (pcVar6->data).element.length;
      if (__n == 0) {
        sVar2 = 0;
      }
      else {
        memcpy(write_check_buffer + sVar4,(pcVar6->data).element.field_0.const_data,__n);
        sVar2 = (pcVar6->data).element.length;
        uVar1 = (buf->data).head.q_len;
      }
      sVar4 = sVar4 + sVar2;
      sVar5 = sVar5 + sVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar1);
  }
  write_check_buffer_pos = sVar4;
  (*handler)(io_stream,handler_context,buf,CIO_SUCCESS,sVar5);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error write_some_all(struct cio_io_stream *io_stream, struct cio_write_buffer *buf, cio_io_stream_write_handler_t handler, void *handler_context)
{
	struct cio_write_buffer *wb = buf->next;
	size_t total_length = 0;

	for (size_t i = 0; i < cio_write_buffer_get_num_buffer_elements(buf); i++) {
		if (wb->data.element.length > 0) {
			memcpy(&write_check_buffer[write_check_buffer_pos], wb->data.element.const_data, wb->data.element.length);
		}

		write_check_buffer_pos += wb->data.element.length;
		total_length += wb->data.element.length;
		wb = wb->next;
	}

	handler(io_stream, handler_context, buf, CIO_SUCCESS, total_length);

	return CIO_SUCCESS;
}